

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Instruction::setImmediateOperand(Instruction *this,uint idx,uint immediate)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  reference local_28;
  value_type local_18;
  uint local_14;
  uint immediate_local;
  uint idx_local;
  Instruction *this_local;
  
  local_18 = immediate;
  local_14 = idx;
  _immediate_local = this;
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->idOperand,(ulong)idx);
  bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_28);
  vVar1 = local_18;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!idOperand[idx]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x7b,"void spv::Instruction::setImmediateOperand(unsigned int, unsigned int)");
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->operands,(ulong)local_14);
  *pvVar3 = vVar1;
  return;
}

Assistant:

void setImmediateOperand(unsigned idx, unsigned int immediate) {
        assert(!idOperand[idx]);
        operands[idx] = immediate;
    }